

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void idx2::Resize<idx2::stack_string<128>>(array<idx2::stack_string<128>_> *Array,i64 NewSize)

{
  undefined1 (*pauVar1) [32];
  byte *pbVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::stack_string<128>>(Array,NewSize);
  }
  if (Array->Size < NewSize) {
    pbVar2 = (Array->Buffer).Data;
    auVar4 = ZEXT816(0) << 0x40;
    for (lVar3 = Array->Size * 0x81; NewSize * 0x81 - lVar3 != 0; lVar3 = lVar3 + 0x81) {
      pauVar1 = (undefined1 (*) [32])(pbVar2 + lVar3);
      pauVar1[3] = ZEXT1632(auVar4);
      pauVar1[2] = ZEXT1632(auVar4);
      pauVar1[1] = ZEXT1632(auVar4);
      *pauVar1 = ZEXT1632(auVar4);
      pauVar1[4][0] = '\0';
    }
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}